

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_server_events_cb(epoll_event *ev)

{
  nh_server_t *pnVar1;
  int iVar2;
  nh_session_t *session;
  
  pnVar1 = (nh_server_t *)(ev->data).u64;
  iVar2 = accept(pnVar1->socket,(sockaddr *)&pnVar1->addr,&pnVar1->addr_len);
  while( true ) {
    if (iVar2 < 1) {
      return;
    }
    session = (nh_session_t *)calloc(1,0xd0);
    if (session == (nh_session_t *)0x0) break;
    session->socket = iVar2;
    session->timeout = pnVar1->timeout;
    session->handler = nh_session_event_cb;
    session->server = pnVar1;
    (session->context).session = session;
    nh_session_register_events(session);
    session->state = SESSION_READ;
    nh_session_handler(session);
    iVar2 = accept(pnVar1->socket,(sockaddr *)&pnVar1->addr,&pnVar1->addr_len);
  }
  __assert_fail("session != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/unbyte[P]naive-httpserver/lib/server.c"
                ,0x313,"void nh_server_events_cb(struct epoll_event *)");
}

Assistant:

void nh_server_events_cb(struct epoll_event *ev) {
    nh_server_t *server = (nh_server_t *) ev->data.ptr;
    int socket;
    while ((socket = accept(server->socket, (struct sockaddr *) &server->addr, &server->addr_len)) > 0) {
        // init session
        nh_session_t *session = (nh_session_t *) calloc(1, sizeof(nh_session_t));
        assert(session != NULL);
        session->socket = socket;
        session->timeout = server->timeout;
        session->handler = nh_session_event_cb;
        session->server = server;
        session->context.session = session;
        // add events on epoll
        nh_session_register_events(session);
        // start process
        session->state = SESSION_READ;
        nh_session_handler(session);
    }
}